

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O1

void __thiscall EventLoop::removeChannel(EventLoop *this,ChannelPtr *channel)

{
  EPoller *this_00;
  ChannelPtr local_28;
  
  if (((channel->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->loop_ == this) {
    assertInLoopThread(this);
    this_00 = (this->poller_).super___shared_ptr<EPoller,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_28.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (channel->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_28.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (channel->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    (channel->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (channel->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
    EPoller::removeChannel(this_00,&local_28);
    if (local_28.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_28.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ;
    }
    return;
  }
  __assert_fail("channel->ownerLoop() == this",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EventLoop.cpp"
                ,0x53,"void EventLoop::removeChannel(ChannelPtr)");
}

Assistant:

void EventLoop::removeChannel(ChannelPtr channel) {
    assert(channel->ownerLoop() == this);
    assertInLoopThread();
    poller_->removeChannel(std::move(channel));
}